

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_names(parser *p)

{
  undefined8 *puVar1;
  undefined8 *p_00;
  void *p_01;
  char **ppcVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  
  p_01 = parser_priv(p);
  name_sections = (char ***)mem_zalloc(0x18);
  lVar6 = 0;
  do {
    ppcVar2 = (char **)mem_alloc((ulong)(*(int *)((long)p_01 + lVar6 * 4 + 4) + 1) << 3);
    name_sections[lVar6] = ppcVar2;
    plVar4 = *(long **)((long)p_01 + lVar6 * 8 + 0x10);
    uVar3 = (ulong)*(uint *)((long)p_01 + lVar6 * 4 + 4);
    if (plVar4 != (long *)0x0) {
      uVar5 = 0;
      do {
        if (uVar3 == uVar5) break;
        name_sections[lVar6][uVar5] = (char *)plVar4[1];
        uVar5 = uVar5 + 1;
        plVar4 = (long *)*plVar4;
      } while (plVar4 != (long *)0x0);
    }
    name_sections[lVar6][uVar3] = (char *)0x0;
    p_00 = *(undefined8 **)((long)p_01 + lVar6 * 8 + 0x10);
    while (p_00 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*p_00;
      mem_free(p_00);
      *(undefined8 **)((long)p_01 + lVar6 * 8 + 0x10) = puVar1;
      p_00 = puVar1;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      mem_free(p_01);
      parser_destroy(p);
      return 0;
    }
  } while( true );
}

Assistant:

static errr finish_parse_names(struct parser *p) {
	int i;
	unsigned int j;
	struct names_parse *n = parser_priv(p);
	struct name *nm;
	name_sections = mem_zalloc(sizeof(char**) * RANDNAME_NUM_TYPES);
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		name_sections[i] = mem_alloc(sizeof(char*) * (n->nnames[i] + 1));
		for (nm = n->names[i], j = 0; nm && j < n->nnames[i]; nm = nm->next, j++) {
			name_sections[i][j] = nm->str;
		}
		name_sections[i][n->nnames[i]] = NULL;
		while (n->names[i]) {
			nm = n->names[i]->next;
			mem_free(n->names[i]);
			n->names[i] = nm;
		}
	}
	mem_free(n);
	parser_destroy(p);
	return 0;
}